

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_sao.c
# Opt level: O2

void ihevc_sao_edge_offset_class2
               (UWORD8 *pu1_src,WORD32 src_strd,UWORD8 *pu1_src_left,UWORD8 *pu1_src_top,
               UWORD8 *pu1_src_top_left,UWORD8 *pu1_src_top_right,UWORD8 *pu1_src_bot_left,
               UWORD8 *pu1_avail,WORD8 *pi1_sao_offset,WORD32 wd,WORD32 ht)

{
  UWORD8 UVar1;
  byte *pbVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  byte *pbVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  UWORD8 *pUVar13;
  byte bVar14;
  byte *pbVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  UWORD8 au1_src_top_tmp [64];
  UWORD8 au1_src_left_tmp [64];
  WORD8 au1_sign_up_tmp [65];
  UWORD8 *local_1a0;
  byte abStack_189 [145];
  UWORD8 aUStack_f8 [64];
  UWORD8 aUStack_b8 [64];
  byte local_78 [72];
  
  abStack_189[1] = 0xff;
  abStack_189[2] = 0xff;
  abStack_189[3] = 0xff;
  abStack_189[4] = 0xff;
  abStack_189[5] = 0xff;
  abStack_189[6] = 0xff;
  abStack_189[7] = 0xff;
  abStack_189[8] = 0xff;
  abStack_189[9] = 0xff;
  abStack_189[10] = 0xff;
  abStack_189[0xb] = 0xff;
  abStack_189[0xc] = 0xff;
  abStack_189[0xd] = 0xff;
  abStack_189[0xe] = 0xff;
  abStack_189[0xf] = 0xff;
  abStack_189[0x10] = 0xff;
  abStack_189[0x11] = 0xff;
  abStack_189[0x12] = 0xff;
  abStack_189[0x13] = 0xff;
  abStack_189[0x14] = 0xff;
  abStack_189[0x15] = 0xff;
  abStack_189[0x16] = 0xff;
  abStack_189[0x17] = 0xff;
  abStack_189[0x18] = 0xff;
  abStack_189[0x19] = 0xff;
  abStack_189[0x1a] = 0xff;
  abStack_189[0x1b] = 0xff;
  abStack_189[0x1c] = 0xff;
  abStack_189[0x1d] = 0xff;
  abStack_189[0x1e] = 0xff;
  abStack_189[0x1f] = 0xff;
  abStack_189[0x20] = 0xff;
  abStack_189[0x21] = 0xff;
  abStack_189[0x22] = 0xff;
  abStack_189[0x23] = 0xff;
  abStack_189[0x24] = 0xff;
  abStack_189[0x25] = 0xff;
  abStack_189[0x26] = 0xff;
  abStack_189[0x27] = 0xff;
  abStack_189[0x28] = 0xff;
  abStack_189[0x29] = 0xff;
  abStack_189[0x2a] = 0xff;
  abStack_189[0x2b] = 0xff;
  abStack_189[0x2c] = 0xff;
  abStack_189[0x2d] = 0xff;
  abStack_189[0x2e] = 0xff;
  abStack_189[0x2f] = 0xff;
  abStack_189[0x30] = 0xff;
  abStack_189[0x31] = 0xff;
  abStack_189[0x32] = 0xff;
  abStack_189[0x33] = 0xff;
  abStack_189[0x34] = 0xff;
  abStack_189[0x35] = 0xff;
  abStack_189[0x36] = 0xff;
  abStack_189[0x37] = 0xff;
  abStack_189[0x38] = 0xff;
  abStack_189[0x39] = 0xff;
  abStack_189[0x3a] = 0xff;
  abStack_189[0x3b] = 0xff;
  abStack_189[0x3c] = 0xff;
  abStack_189[0x3d] = 0xff;
  abStack_189[0x3e] = 0xff;
  abStack_189[0x3f] = 0xff;
  abStack_189[0x40] = 0xff;
  lVar19 = (long)wd;
  UVar1 = pu1_src_top[lVar19 + -1];
  lVar4 = (long)src_strd;
  uVar5 = 0;
  uVar8 = 0;
  if (0 < ht) {
    uVar8 = (ulong)(uint)ht;
  }
  pUVar13 = pu1_src + lVar19 + -1;
  for (; uVar8 != uVar5; uVar5 = uVar5 + 1) {
    aUStack_b8[uVar5] = *pUVar13;
    pUVar13 = pUVar13 + lVar4;
  }
  iVar17 = (ht + -1) * src_strd;
  uVar5 = 0;
  uVar8 = 0;
  if (0 < wd) {
    uVar8 = (ulong)(uint)wd;
  }
  for (; uVar8 != uVar5; uVar5 = uVar5 + 1) {
    aUStack_f8[uVar5] = pu1_src[uVar5 + (long)iVar17];
  }
  bVar14 = *pu1_src;
  uVar18 = (uint)bVar14;
  if (pu1_avail[4] != '\0') {
    uVar11 = bVar14 == *pu1_src_top_left ^ 3;
    if (bVar14 < *pu1_src_top_left) {
      uVar11 = 1;
    }
    uVar12 = 0xffffffff;
    if (pu1_src[lVar4 + 1] <= bVar14) {
      uVar12 = (uint)(bVar14 != pu1_src[lVar4 + 1]);
    }
    if (uVar12 + uVar11 != 2) {
      uVar11 = (int)pi1_sao_offset[gi4_ihevc_table_edge_idx[uVar12 + uVar11]] + (uint)bVar14;
      uVar18 = 0xff;
      if (((int)uVar11 < 0x100) && (uVar18 = 0, 0 < (int)uVar11)) {
        uVar18 = uVar11;
      }
    }
  }
  iVar7 = wd + -1 + iVar17;
  bVar14 = pu1_src[iVar7];
  uVar11 = (uint)bVar14;
  if (pu1_avail[7] != '\0') {
    uVar12 = bVar14 == pu1_src[iVar7 + ~src_strd] ^ 3;
    if (bVar14 < pu1_src[iVar7 + ~src_strd]) {
      uVar12 = 1;
    }
    uVar3 = 0xffffffff;
    if (pu1_src[wd + src_strd + iVar17] <= bVar14) {
      uVar3 = (uint)(bVar14 != pu1_src[wd + src_strd + iVar17]);
    }
    if (uVar3 + uVar12 != 2) {
      uVar12 = (int)pi1_sao_offset[gi4_ihevc_table_edge_idx[uVar3 + uVar12]] + (uint)bVar14;
      uVar11 = 0xff;
      if (((int)uVar12 < 0x100) && (uVar11 = 0, 0 < (int)uVar12)) {
        uVar11 = uVar12;
      }
    }
  }
  if (*pu1_avail == '\0') {
    abStack_189[1] = 0;
    abStack_189[2] = 0xff;
    abStack_189[3] = 0xff;
    abStack_189[4] = 0xff;
  }
  if (pu1_avail[2] == '\0') {
    pu1_src = pu1_src + lVar4;
    iVar17 = -src_strd;
    for (lVar6 = 1; lVar6 < lVar19; lVar6 = lVar6 + 1) {
      bVar14 = pu1_src[lVar6] != pu1_src[iVar17];
      if (pu1_src[lVar6] < pu1_src[iVar17]) {
        bVar14 = 0xff;
      }
      abStack_189[lVar6 + 0x41] = bVar14;
      iVar17 = iVar17 + 1;
    }
    local_1a0 = pu1_src_left + 1;
    ht = ht + -1;
  }
  else {
    for (lVar6 = 1; local_1a0 = pu1_src_left, lVar6 < lVar19; lVar6 = lVar6 + 1) {
      bVar14 = pu1_src[lVar6] != pu1_src_top[lVar6 + -1];
      if (pu1_src[lVar6] < pu1_src_top[lVar6 + -1]) {
        bVar14 = 0xff;
      }
      abStack_189[lVar6 + 0x41] = bVar14;
    }
  }
  if (pu1_avail[1] == '\0') {
    abStack_189[lVar19] = 0;
  }
  uVar12 = ht - (uint)(pu1_avail[3] == '\0');
  uVar16 = 0;
  uVar5 = 0;
  if (0 < (int)uVar12) {
    uVar5 = (ulong)uVar12;
  }
  pbVar2 = abStack_189 + 0x41;
  pbVar15 = local_78;
  for (; pbVar9 = pbVar2, uVar16 != uVar5; uVar16 = uVar16 + 1) {
    bVar14 = *pu1_src != local_1a0[uVar16 - 1];
    if (*pu1_src < local_1a0[uVar16 - 1]) {
      bVar14 = 0xff;
    }
    *pbVar9 = bVar14;
    for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
      uVar3 = (uint)(pu1_src[uVar10] != pu1_src[uVar10 + lVar4 + 1]);
      if (pu1_src[uVar10] < pu1_src[uVar10 + lVar4 + 1]) {
        uVar3 = 0xffffffff;
      }
      bVar14 = pbVar9[uVar10];
      pbVar15[uVar10 + 1] = -(char)uVar3;
      if (((uint)abStack_189[uVar10 + 1] &
          gi4_ihevc_table_edge_idx[(long)(char)bVar14 + (long)(int)uVar3 + 2]) != 0) {
        iVar17 = (int)pi1_sao_offset
                      [(uint)abStack_189[uVar10 + 1] &
                       gi4_ihevc_table_edge_idx[(long)(char)bVar14 + (long)(int)uVar3 + 2]] +
                 (uint)pu1_src[uVar10];
        if (iVar17 < 1) {
          iVar17 = 0;
        }
        if (0xfe < iVar17) {
          iVar17 = 0xff;
        }
        pu1_src[uVar10] = (byte)iVar17;
      }
    }
    pu1_src = pu1_src + lVar4;
    pbVar2 = pbVar15;
    pbVar15 = pbVar9;
  }
  uVar3 = uVar12;
  if (pu1_avail[2] == '\0') {
    uVar3 = uVar12 + 1;
  }
  pu1_src[(int)-(uVar3 * src_strd)] = (byte)uVar18;
  uVar5 = 0;
  if (pu1_avail[3] == '\0') {
    src_strd = 0;
  }
  pu1_src[(wd + -1) - src_strd] = (byte)uVar11;
  if (pu1_avail[2] == '\0') {
    uVar12 = uVar12 + 1;
  }
  uVar12 = uVar12 + (pu1_avail[3] == '\0');
  *pu1_src_top_left = UVar1;
  uVar16 = (ulong)uVar12;
  if ((int)uVar12 < 1) {
    uVar16 = uVar5;
  }
  for (; uVar16 != uVar5; uVar5 = uVar5 + 1) {
    pu1_src_left[uVar5] = aUStack_b8[uVar5];
  }
  for (uVar5 = 0; uVar8 != uVar5; uVar5 = uVar5 + 1) {
    pu1_src_top[uVar5] = aUStack_f8[uVar5];
  }
  return;
}

Assistant:

void ihevc_sao_edge_offset_class2(UWORD8 *pu1_src,
                                  WORD32 src_strd,
                                  UWORD8 *pu1_src_left,
                                  UWORD8 *pu1_src_top,
                                  UWORD8 *pu1_src_top_left,
                                  UWORD8 *pu1_src_top_right,
                                  UWORD8 *pu1_src_bot_left,
                                  UWORD8 *pu1_avail,
                                  WORD8 *pi1_sao_offset,
                                  WORD32 wd,
                                  WORD32 ht)
{
    WORD32 row, col;
    UWORD8 au1_mask[MAX_CTB_SIZE];
    UWORD8 au1_src_left_tmp[MAX_CTB_SIZE], au1_src_top_tmp[MAX_CTB_SIZE];
    UWORD8 u1_src_top_left_tmp;
    WORD8 au1_sign_up[MAX_CTB_SIZE + 1], au1_sign_up_tmp[MAX_CTB_SIZE + 1];
    WORD8 u1_sign_down;
    WORD8 *pu1_sign_up;
    WORD8 *pu1_sign_up_tmp;
    UWORD8 *pu1_src_left_cpy;

    WORD32 bit_depth;
    UWORD8 u1_pos_0_0_tmp;
    UWORD8 u1_pos_wd_ht_tmp;
    UNUSED(pu1_src_top_right);
    UNUSED(pu1_src_bot_left);

    bit_depth = BIT_DEPTH_LUMA;
    pu1_sign_up = au1_sign_up;
    pu1_sign_up_tmp = au1_sign_up_tmp;
    pu1_src_left_cpy = pu1_src_left;

    /* Initialize the mask values */
    memset(au1_mask, 0xFF, MAX_CTB_SIZE);

    /* Update left, top and top-left arrays */
    u1_src_top_left_tmp = pu1_src_top[wd - 1];
    for(row = 0; row < ht; row++)
    {
        au1_src_left_tmp[row] = pu1_src[row * src_strd + wd - 1];
    }
    for(col = 0; col < wd; col++)
    {
        au1_src_top_tmp[col] = pu1_src[(ht - 1) * src_strd + col];
    }


    /* If top-left is available, process separately */
    if(0 != pu1_avail[4])
    {
        WORD32 edge_idx;

        edge_idx = 2 + SIGN(pu1_src[0] - pu1_src_top_left[0]) +
                        SIGN(pu1_src[0] - pu1_src[1 + src_strd]);

        edge_idx = gi4_ihevc_table_edge_idx[edge_idx];

        if(0 != edge_idx)
        {
            u1_pos_0_0_tmp = CLIP3(pu1_src[0] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
        }
        else
        {
            u1_pos_0_0_tmp = pu1_src[0];
        }
    }
    else
    {
        u1_pos_0_0_tmp = pu1_src[0];
    }

    /* If bottom-right is available, process separately */
    if(0 != pu1_avail[7])
    {
        WORD32 edge_idx;

        edge_idx = 2 + SIGN(pu1_src[wd - 1 + (ht - 1) * src_strd] - pu1_src[wd - 1 + (ht - 1) * src_strd - 1 - src_strd]) +
                        SIGN(pu1_src[wd - 1 + (ht - 1) * src_strd] - pu1_src[wd - 1 + (ht - 1) * src_strd + 1 + src_strd]);

        edge_idx = gi4_ihevc_table_edge_idx[edge_idx];

        if(0 != edge_idx)
        {
            u1_pos_wd_ht_tmp = CLIP3(pu1_src[wd - 1 + (ht - 1) * src_strd] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
        }
        else
        {
            u1_pos_wd_ht_tmp = pu1_src[wd - 1 + (ht - 1) * src_strd];
        }
    }
    else
    {
        u1_pos_wd_ht_tmp = pu1_src[wd - 1 + (ht - 1) * src_strd];
    }

    /* If Left is not available */
    if(0 == pu1_avail[0])
    {
        au1_mask[0] = 0;
    }

    /* If Top is not available */
    if(0 == pu1_avail[2])
    {
        pu1_src += src_strd;
        ht--;
        pu1_src_left_cpy += 1;
        for(col = 1; col < wd; col++)
        {
            pu1_sign_up[col] = SIGN(pu1_src[col] - pu1_src[col - 1 - src_strd]);
        }
    }
    else
    {
        for(col = 1; col < wd; col++)
        {
            pu1_sign_up[col] = SIGN(pu1_src[col] - pu1_src_top[col - 1]);
        }
    }

    /* If Right is not available */
    if(0 == pu1_avail[1])
    {
        au1_mask[wd - 1] = 0;
    }

    /* If Bottom is not available */
    if(0 == pu1_avail[3])
    {
        ht--;
    }

    /* Processing is done on the intermediate buffer and the output is written to the source buffer */
    {
        for(row = 0; row < ht; row++)
        {
            pu1_sign_up[0] = SIGN(pu1_src[0] - pu1_src_left_cpy[row - 1]);
            for(col = 0; col < wd; col++)
            {
                WORD32 edge_idx;

                u1_sign_down = SIGN(pu1_src[col] - pu1_src[col + 1 + src_strd]);
                edge_idx = 2 + pu1_sign_up[col] + u1_sign_down;
                pu1_sign_up_tmp[col + 1] = -u1_sign_down;

                edge_idx = gi4_ihevc_table_edge_idx[edge_idx] & au1_mask[col];

                if(0 != edge_idx)
                {
                    pu1_src[col] = CLIP3(pu1_src[col] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
                }
            }

            /* Swapping pu1_sign_up_tmp and pu1_sign_up */
            {
                WORD8 *pu1_swap_tmp = pu1_sign_up;
                pu1_sign_up = pu1_sign_up_tmp;
                pu1_sign_up_tmp = pu1_swap_tmp;
            }

            pu1_src += src_strd;
        }

        pu1_src[-(pu1_avail[2] ? ht : ht + 1) * src_strd] = u1_pos_0_0_tmp;
        pu1_src[(pu1_avail[3] ? wd - 1 - src_strd : wd - 1)] = u1_pos_wd_ht_tmp;
    }

    if(0 == pu1_avail[2])
        ht++;
    if(0 == pu1_avail[3])
        ht++;
    *pu1_src_top_left = u1_src_top_left_tmp;
    for(row = 0; row < ht; row++)
    {
        pu1_src_left[row] = au1_src_left_tmp[row];
    }
    for(col = 0; col < wd; col++)
    {
        pu1_src_top[col] = au1_src_top_tmp[col];
    }

}